

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O2

Mat * __thiscall
ncnn::ModelBinFromStdio::load(Mat *__return_storage_ptr__,ModelBinFromStdio *this,int w,int type)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  Mat *this_00;
  ulong uVar5;
  size_type __new_size;
  anon_union_4_2_77b30072 flag_struct;
  uint local_494;
  uint local_490;
  uint local_48c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> index_array;
  Mat m;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  int local_40c;
  size_t local_408;
  
  if ((FILE *)this->binfp == (FILE *)0x0) {
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->elemsize = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    goto LAB_00127fd2;
  }
  if (type == 1) {
LAB_00127fd9:
    Mat::Mat((Mat *)&float16_weights,w,4,(Allocator *)0x0);
    if (((float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) ||
        ((long)local_40c * local_408 == 0)) ||
       (sVar2 = fread(float16_weights.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start,(long)w << 2,1,(FILE *)this->binfp),
       (int)sVar2 == 1)) {
      Mat::Mat(__return_storage_ptr__,(Mat *)&float16_weights);
    }
    else {
      fprintf(_stderr,"ModelBin read weight_data failed %d\n",sVar2 & 0xffffffff);
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->elemsize = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->cstep = 0;
    }
    this_00 = (Mat *)&float16_weights;
    goto LAB_0012803b;
  }
  if (type == 0) {
    sVar2 = fread(&flag_struct,4,1,(FILE *)this->binfp);
    if ((int)sVar2 == 1) {
      if (flag_struct.tag == 0x2c056) goto LAB_00127fd9;
      if (flag_struct.tag == 0xd4b38) {
        float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        uVar5 = (long)(w + 3) & 0xfffffffffffffffc;
        std::vector<signed_char,_std::allocator<signed_char>_>::resize
                  ((vector<signed_char,_std::allocator<signed_char>_> *)&float16_weights,uVar5);
        sVar2 = fread(float16_weights.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start,uVar5,1,(FILE *)this->binfp);
        if ((int)sVar2 == 1) {
          Mat::Mat(__return_storage_ptr__,w,1,(Allocator *)0x0);
          if ((__return_storage_ptr__->data != (void *)0x0) &&
             ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
            memcpy(__return_storage_ptr__->data,
                   float16_weights.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start,(long)w);
          }
        }
        else {
          fprintf(_stderr,"ModelBin read int8_weights failed %d\n",sVar2 & 0xffffffff);
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->refcount = (int *)0x0;
          __return_storage_ptr__->elemsize = 0;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 0;
          __return_storage_ptr__->w = 0;
          __return_storage_ptr__->h = 0;
          __return_storage_ptr__->c = 0;
          __return_storage_ptr__->cstep = 0;
        }
        std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
                  ((_Vector_base<signed_char,_std::allocator<signed_char>_> *)&float16_weights);
        return __return_storage_ptr__;
      }
      if (flag_struct.tag == 0x1306b47) {
        float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar5 = (long)(((ulong)(uint)w << 0x21) + 0x300000000) >> 0x20 & 0xfffffffffffffffc;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&float16_weights,uVar5)
        ;
        sVar2 = fread(float16_weights.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start,uVar5,1,(FILE *)this->binfp);
        if ((int)sVar2 == 1) {
          Mat::from_float16(__return_storage_ptr__,
                            float16_weights.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start,w);
        }
        else {
          fprintf(_stderr,"ModelBin read float16_weights failed %d\n",sVar2 & 0xffffffff);
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->refcount = (int *)0x0;
          __return_storage_ptr__->elemsize = 0;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 0;
          __return_storage_ptr__->w = 0;
          __return_storage_ptr__->h = 0;
          __return_storage_ptr__->c = 0;
          __return_storage_ptr__->cstep = 0;
        }
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                  (&float16_weights.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
        return __return_storage_ptr__;
      }
      local_490 = flag_struct.tag & 0xff;
      local_494 = flag_struct.tag >> 0x10 & 0xff;
      local_48c = flag_struct.tag >> 0x18;
      Mat::Mat(&m,w,4,(Allocator *)0x0);
      if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
LAB_00128354:
        Mat::Mat(__return_storage_ptr__,&m);
      }
      else {
        if ((flag_struct.tag >> 8 & 0xff) + local_490 + local_494 == 0 && local_48c == 0) {
          if (flag_struct.field_0.f0 == '\0') {
            sVar2 = fread(m.data,(long)w << 2,1,(FILE *)this->binfp);
            uVar1 = (uint)sVar2;
            if (uVar1 != 1) {
              pcVar4 = "ModelBin read weight_data failed %d\n";
              goto LAB_001282f8;
            }
          }
          goto LAB_00128354;
        }
        sVar2 = fread(&float16_weights,0x400,1,(FILE *)this->binfp);
        uVar1 = (uint)sVar2;
        if (uVar1 == 1) {
          index_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          index_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          index_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          __new_size = (size_type)(int)(w + 3U & 0xfffffffc);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&index_array,__new_size);
          sVar2 = fread(index_array.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,__new_size,1,(FILE *)this->binfp);
          if ((int)sVar2 == 1) {
            uVar3 = 0;
            uVar5 = (ulong)(uint)w;
            if (w < 1) {
              uVar5 = uVar3;
            }
            for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
              *(undefined4 *)((long)m.data + uVar3 * 4) =
                   *(undefined4 *)
                    ((long)&float16_weights.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start +
                    (ulong)index_array.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar3] * 4);
            }
          }
          else {
            fprintf(_stderr,"ModelBin read index_array failed %d\n",sVar2 & 0xffffffff);
            __return_storage_ptr__->data = (void *)0x0;
            __return_storage_ptr__->refcount = (int *)0x0;
            __return_storage_ptr__->elemsize = 0;
            __return_storage_ptr__->allocator = (Allocator *)0x0;
            __return_storage_ptr__->dims = 0;
            __return_storage_ptr__->w = 0;
            __return_storage_ptr__->h = 0;
            __return_storage_ptr__->c = 0;
            __return_storage_ptr__->cstep = 0;
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&index_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
          ;
          if ((int)sVar2 == 1) goto LAB_00128354;
        }
        else {
          pcVar4 = "ModelBin read quantization_value failed %d\n";
LAB_001282f8:
          fprintf(_stderr,pcVar4,(ulong)uVar1);
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->refcount = (int *)0x0;
          __return_storage_ptr__->elemsize = 0;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 0;
          __return_storage_ptr__->w = 0;
          __return_storage_ptr__->h = 0;
          __return_storage_ptr__->c = 0;
          __return_storage_ptr__->cstep = 0;
        }
      }
      this_00 = &m;
LAB_0012803b:
      Mat::~Mat(this_00);
      return __return_storage_ptr__;
    }
    pcVar4 = "ModelBin read flag_struct failed %d\n";
    uVar5 = sVar2 & 0xffffffff;
  }
  else {
    pcVar4 = "ModelBin load type %d not implemented\n";
    uVar5 = (ulong)(uint)type;
  }
  fprintf(_stderr,pcVar4,uVar5);
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  __return_storage_ptr__->elemsize = 0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->c = 0;
LAB_00127fd2:
  __return_storage_ptr__->cstep = 0;
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromStdio::load(int w, int type) const
{
    if (!binfp)
        return Mat();

    if (type == 0)
    {
        int nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = fread(&flag_struct, sizeof(flag_struct), 1, binfp);
        if (nread != 1)
        {
            fprintf(stderr, "ModelBin read flag_struct failed %d\n", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            int align_data_size = alignSize(w * sizeof(unsigned short), 4);
            std::vector<unsigned short> float16_weights;
            float16_weights.resize(align_data_size);
            nread = fread(float16_weights.data(), align_data_size, 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read float16_weights failed %d\n", nread);
                return Mat();
            }

            return Mat::from_float16(float16_weights.data(), w);
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            int align_data_size = alignSize(w, 4);
            std::vector<signed char> int8_weights;
            int8_weights.resize(align_data_size);
            nread = fread(int8_weights.data(), align_data_size, 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read int8_weights failed %d\n", nread);
                return Mat();
            }

            Mat m(w, (size_t)1u);
            if (m.empty())
                return m;

            memcpy(m.data, int8_weights.data(), w);

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            Mat m(w);
            if (m.empty())
                return m;

            // raw data with extra scaling
            nread = fread(m, w * sizeof(float), 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }

            return m;
        }

        Mat m(w);
        if (m.empty())
            return m;

        if (flag != 0)
        {
            // quantized data
            float quantization_value[256];
            nread = fread(quantization_value, 256 * sizeof(float), 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read quantization_value failed %d\n", nread);
                return Mat();
            }

            int align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = fread(index_array.data(), align_weight_data_size, 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read index_array failed %d\n", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[ index_array[i] ];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // raw data
            nread = fread(m, w * sizeof(float), 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }
        }

        return m;
    }
    else if (type == 1)
    {
        Mat m(w);
        if (m.empty())
            return m;

        // raw data
        int nread = fread(m, w * sizeof(float), 1, binfp);
        if (nread != 1)
        {
            fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
            return Mat();
        }

        return m;
    }
    else
    {
        fprintf(stderr, "ModelBin load type %d not implemented\n", type);
        return Mat();
    }

    return Mat();
}